

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copyall.cpp
# Opt level: O2

int copyall_main(int argc,char **argv)

{
  FILE *pFVar1;
  Status SVar2;
  _Alloc_hider _Var3;
  char cVar4;
  int iVar5;
  long *plVar6;
  Slice SVar7;
  Status status;
  string local_12d0;
  Slice key;
  Slice value;
  string copy_path;
  string path;
  string local_1250;
  DecompressAllocator decompress_allocator;
  DB db;
  DB copy_db;
  
  if ((argc < 4) || (iVar5 = strcmp("help",argv[1]), iVar5 == 0)) {
    printf("Usage: %s copyall <source_minecraft_world_dir> <dest_minecraft_world_dir>\n",*argv);
    return 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&db,argv[2],(allocator<char> *)&copy_db);
  std::operator+(&path,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&db,
                 "/db");
  std::__cxx11::string::~string((string *)&db);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&db,argv[3],(allocator<char> *)&copy_db);
  std::operator+(&copy_path,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&db
                 ,"/db");
  std::__cxx11::string::~string((string *)&db);
  mcberepair::DB::DB(&db,path._M_dataplus._M_p,false,false);
  if ((__uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>)
      db.db_._M_t.super___uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>._M_t.
      super__Tuple_impl<0UL,_leveldb::DB_*,_std::default_delete<leveldb::DB>_>.
      super__Head_base<0UL,_leveldb::DB_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>)0x0) {
    iVar5 = 1;
    fprintf(_stderr,"ERROR: Opening \'%s\' failed.\n",path._M_dataplus._M_p);
  }
  else {
    mcberepair::DB::DB(&copy_db,copy_path._M_dataplus._M_p,true,true);
    if ((__uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>)
        copy_db.db_._M_t.super___uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>._M_t.
        super__Tuple_impl<0UL,_leveldb::DB_*,_std::default_delete<leveldb::DB>_>.
        super__Head_base<0UL,_leveldb::DB_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>)0x0) {
      fprintf(_stderr,"ERROR: Opening \'%s\' failed.\n",copy_path._M_dataplus._M_p);
      iVar5 = 1;
    }
    else {
      decompress_allocator._vptr_DecompressAllocator =
           (_func_int **)&PTR__DecompressAllocator_0012f550;
      decompress_allocator.mutex.super___mutex_base._M_mutex.__align = 0;
      decompress_allocator.mutex.super___mutex_base._M_mutex._8_8_ = 0;
      decompress_allocator.mutex.super___mutex_base._M_mutex._16_8_ = 0;
      decompress_allocator.mutex.super___mutex_base._M_mutex.__data.__list.__prev =
           (__pthread_internal_list *)0x0;
      decompress_allocator.mutex.super___mutex_base._M_mutex.__data.__list.__next =
           (__pthread_internal_list *)0x0;
      decompress_allocator.stack.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      decompress_allocator.stack.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      decompress_allocator.stack.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      plVar6 = (long *)(**(code **)(*(long *)db.db_._M_t.
                                             super___uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_leveldb::DB_*,_std::default_delete<leveldb::DB>_>
                                             .super__Head_base<0UL,_leveldb::DB_*,_false>.
                                             _M_head_impl + 0x30))();
      status.state_ = (char *)0x0;
      (**(code **)(*plVar6 + 0x18))(plVar6);
      while( true ) {
        cVar4 = (**(code **)(*plVar6 + 0x10))(plVar6);
        if (cVar4 == '\0') break;
        SVar7 = (Slice)(**(code **)(*plVar6 + 0x40))(plVar6);
        key = SVar7;
        SVar7 = (Slice)(**(code **)(*plVar6 + 0x48))(plVar6);
        local_1250._M_dataplus._M_p._0_1_ = 0;
        value = SVar7;
        (**(code **)(*(long *)copy_db.db_._M_t.
                              super___uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_leveldb::DB_*,_std::default_delete<leveldb::DB>_>
                              .super__Head_base<0UL,_leveldb::DB_*,_false>._M_head_impl + 0x10))
                  (&local_12d0,
                   copy_db.db_._M_t.
                   super___uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>._M_t.
                   super__Tuple_impl<0UL,_leveldb::DB_*,_std::default_delete<leveldb::DB>_>.
                   super__Head_base<0UL,_leveldb::DB_*,_false>._M_head_impl,&local_1250,&key,&value)
        ;
        SVar2 = status;
        status.state_ = local_12d0._M_dataplus._M_p;
        local_12d0._M_dataplus._M_p = SVar2.state_;
        leveldb::Status::~Status((Status *)&local_12d0);
        pFVar1 = _stderr;
        if (status.state_ != (char *)0x0) {
          leveldb::Slice::ToString_abi_cxx11_(&local_12d0,&key);
          _Var3._M_p = local_12d0._M_dataplus._M_p;
          leveldb::Status::ToString_abi_cxx11_(&local_1250,&status);
          fprintf(pFVar1,"ERROR: copying key \'%s\' failed: %s\n",_Var3._M_p,
                  CONCAT71(local_1250._M_dataplus._M_p._1_7_,local_1250._M_dataplus._M_p._0_1_));
          std::__cxx11::string::~string((string *)&local_1250);
          goto LAB_00108a33;
        }
        (**(code **)(*plVar6 + 0x30))(plVar6);
      }
      iVar5 = 0;
      (**(code **)(*(long *)copy_db.db_._M_t.
                            super___uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_leveldb::DB_*,_std::default_delete<leveldb::DB>_>
                            .super__Head_base<0UL,_leveldb::DB_*,_false>._M_head_impl + 0x58))
                (copy_db.db_._M_t.
                 super___uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>._M_t.
                 super__Tuple_impl<0UL,_leveldb::DB_*,_std::default_delete<leveldb::DB>_>.
                 super__Head_base<0UL,_leveldb::DB_*,_false>._M_head_impl,0,0);
      pFVar1 = _stderr;
      if (status.state_ != (char *)0x0) {
        leveldb::Status::ToString_abi_cxx11_(&local_12d0,&status);
        fprintf(pFVar1,"ERROR: copying \'%s\' to \'%s\' failed: %s\n",path._M_dataplus._M_p,
                copy_path._M_dataplus._M_p,local_12d0._M_dataplus._M_p);
LAB_00108a33:
        std::__cxx11::string::~string((string *)&local_12d0);
        iVar5 = 1;
      }
      leveldb::Status::~Status(&status);
      (**(code **)(*plVar6 + 8))(plVar6);
      leveldb::DecompressAllocator::~DecompressAllocator(&decompress_allocator);
    }
    mcberepair::DB::~DB(&copy_db);
  }
  mcberepair::DB::~DB(&db);
  std::__cxx11::string::~string((string *)&copy_path);
  std::__cxx11::string::~string((string *)&path);
  return iVar5;
}

Assistant:

int copyall_main(int argc, char *argv[]) {
    if(argc < 4 || strcmp("help", argv[1]) == 0) {
        printf(
            "Usage: %s copyall <source_minecraft_world_dir> "
            "<dest_minecraft_world_dir>\n",
            argv[0]);
        return EXIT_FAILURE;
    }

    // construct path for Minecraft BE database
    std::string path = std::string(argv[2]) + "/db";
    std::string copy_path = std::string(argv[3]) + "/db";

    // open the input database
    mcberepair::DB db{path.c_str()};

    if(!db) {
        fprintf(stderr, "ERROR: Opening '%s' failed.\n", path.c_str());
        return EXIT_FAILURE;
    }

    // open the destination database
    mcberepair::DB copy_db{copy_path.c_str(), true, true};

    if(!copy_db) {
        fprintf(stderr, "ERROR: Opening '%s' failed.\n", copy_path.c_str());
        return EXIT_FAILURE;
    }

    // create a reusable memory space for decompression so it allocates less
    leveldb::ReadOptions readOptions;
    leveldb::DecompressAllocator decompress_allocator;
    readOptions.decompress_allocator = &decompress_allocator;
    readOptions.verify_checksums = true;
    readOptions.fill_cache = false;

    // create an iterator for the database
    auto it = std::unique_ptr<leveldb::Iterator>{db().NewIterator(readOptions)};

    leveldb::Status status;

    for(it->SeekToFirst(); it->Valid(); it->Next()) {
        auto key = it->key();
        auto value = it->value();
        status = copy_db().Put({}, key, value);
        if(!status.ok()) {
            // LCOV_EXCL_START
            fprintf(stderr, "ERROR: copying key '%s' failed: %s\n",
                    key.ToString().c_str(), status.ToString().c_str());
            return EXIT_FAILURE;
            // LCOV_EXCL_STOP
        }
    }
    copy_db().CompactRange(nullptr, nullptr);

    if(!status.ok()) {
        // LCOV_EXCL_START
        fprintf(stderr, "ERROR: copying '%s' to '%s' failed: %s\n",
                path.c_str(), copy_path.c_str(), status.ToString().c_str());
        return EXIT_FAILURE;
        // LCOV_EXCL_STOP
    }
    return EXIT_SUCCESS;
}